

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmanvector.h
# Opt level: O0

void __thiscall
TPZManVector<std::complex<double>,_1000>::~TPZManVector
          (TPZManVector<std::complex<double>,_1000> *this)

{
  TPZVec<std::complex<double>_> *in_RDI;
  
  in_RDI->_vptr_TPZVec = (_func_int **)&PTR__TPZManVector_02564aa0;
  if ((TPZVec<std::complex<double>_> *)in_RDI->fStore == in_RDI + 1) {
    in_RDI->fStore = (complex<double> *)0x0;
  }
  in_RDI->fNAlloc = 0;
  TPZVec<std::complex<double>_>::~TPZVec(in_RDI);
  return;
}

Assistant:

TPZManVector< T, NumExtAlloc >::~TPZManVector() {
    if (this->fStore == fExtAlloc) {
        this->fStore = nullptr;
    }
    this->fNAlloc = 0;
}